

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest>::
AddTestPattern(ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest> *this,
              char *test_suite_name,char *test_base_name,
              TestMetaFactoryBase<std::tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
              *meta_factory,CodeLocation *code_location)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  pointer __result;
  pointer psVar2;
  pointer psVar3;
  ulong uVar4;
  _Tp_alloc_type *__alloc;
  pointer __first;
  ulong uVar5;
  ulong uVar6;
  allocator local_71;
  element_type *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  pointer local_60;
  CodeLocation local_58;
  
  this_00 = (element_type *)operator_new(0x70);
  CodeLocation::CodeLocation(&local_58,(CodeLocation *)meta_factory);
  std::__cxx11::string::string((string *)this_00,"AV1HighbdFwdTxfm2dTest",&local_71);
  std::__cxx11::string::string((string *)&this_00->test_base_name,test_suite_name,&local_71);
  (this_00->test_meta_factory)._M_t.
  super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<std::tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>_>_>
  .
  super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>_*,_false>
       = (_Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>_*,_false>
          )test_base_name;
  CodeLocation::CodeLocation(&this_00->code_location,&local_58);
  local_68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_70 = this_00;
  _Var1._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  (_Var1._M_pi)->_M_use_count = 1;
  (_Var1._M_pi)->_M_weak_count = 1;
  (_Var1._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_00f3f598;
  _Var1._M_pi[1]._vptr__Sp_counted_base = (_func_int **)this_00;
  psVar3 = (this->tests_).
           super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest>::TestInfo>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar3 == (this->tests_).
                super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest>::TestInfo>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __first = (this->tests_).
              super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest>::TestInfo>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_68._M_pi = _Var1._M_pi;
    if ((long)psVar3 - (long)__first == 0x7ffffffffffffff0) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar5 = (long)psVar3 - (long)__first >> 4;
    uVar4 = 1;
    if (psVar3 != __first) {
      uVar4 = uVar5;
    }
    uVar6 = uVar4 + uVar5;
    if (0x7fffffffffffffe < uVar6) {
      uVar6 = 0x7ffffffffffffff;
    }
    __alloc = (_Tp_alloc_type *)(uVar4 + uVar5);
    if (CARRY8(uVar4,uVar5)) {
      uVar6 = 0x7ffffffffffffff;
    }
    if (uVar6 == 0) {
      __result = (pointer)0x0;
    }
    else {
      local_60 = __first;
      __result = (pointer)operator_new(uVar6 << 4);
      _Var1._M_pi = local_68._M_pi;
      this_00 = local_70;
      __first = local_60;
    }
    __result[uVar5].
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = this_00;
    local_68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __result[uVar5].
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = _Var1._M_pi;
    local_70 = (element_type *)0x0;
    psVar2 = std::
             vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest>::TestInfo>_>_>
             ::_S_relocate(__first,psVar3,__result,__alloc);
    psVar3 = std::
             vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest>::TestInfo>_>_>
             ::_S_relocate(psVar3,psVar3,psVar2 + 1,__alloc);
    if (__first != (pointer)0x0) {
      operator_delete(__first);
    }
    (this->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (this->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar3;
    (this->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + uVar6;
  }
  else {
    (psVar3->
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    )._M_ptr = this_00;
    local_68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (psVar3->
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    )._M_refcount._M_pi = _Var1._M_pi;
    local_70 = (element_type *)0x0;
    (this->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar3 + 1;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void AddTestPattern(const char* test_suite_name, const char* test_base_name,
                      TestMetaFactoryBase<ParamType>* meta_factory,
                      CodeLocation code_location) {
    tests_.push_back(std::shared_ptr<TestInfo>(new TestInfo(
        test_suite_name, test_base_name, meta_factory, code_location)));
  }